

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  layer_t lVar1;
  ostream *poVar2;
  ostream *points_00;
  void *pvVar3;
  ostream *poVar4;
  BruteForceIndex *this;
  double dVar5;
  uint32_t i_1;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result2;
  uint32_t i;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result1;
  float *queries;
  rep duration;
  time_point t1;
  time_point t0;
  BruteForceIndex bf_index;
  HNSWIndex hnsw_index;
  L2Distance distance;
  uint32_t K;
  uint32_t ef_construction;
  uint32_t ef_search;
  uint32_t M;
  float *points;
  uint32_t n_queries;
  uint32_t n_points;
  uint32_t dim;
  size_t in_stack_000023f8;
  float *in_stack_00002400;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcac;
  HNSWIndex *in_stack_fffffffffffffcb0;
  Distance *in_stack_fffffffffffffcb8;
  HNSWIndex *in_stack_fffffffffffffcc0;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *this_00;
  float *in_stack_fffffffffffffcc8;
  BruteForceIndex *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffce0;
  int M_00;
  Distance *in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  float *in_stack_fffffffffffffcf8;
  HNSWIndex *in_stack_fffffffffffffd00;
  float *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd10;
  undefined1 *puVar7;
  float *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  HNSWIndex *in_stack_fffffffffffffd38;
  duration<long,_std::ratio<1L,_1000000L>_> local_240;
  undefined8 local_238;
  uint local_214;
  undefined8 local_210;
  undefined1 local_201;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_200;
  rep local_1e8;
  duration<long,_std::ratio<1L,_1000000L>_> local_1e0;
  undefined8 local_1d8;
  uint local_1b4;
  undefined8 local_1b0;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_1a0;
  void *local_188;
  rep local_180;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  long local_170;
  undefined8 local_168;
  undefined8 local_160;
  HNSWIndex local_100;
  ulong local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *local_18;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  int local_4;
  
  M_00 = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  local_4 = 0;
  local_8 = 8;
  local_c = 100000;
  local_10 = 1000;
  local_18 = (vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)operator_new__(3200000);
  GenerateRandomFloat(in_stack_00002400,in_stack_000023f8);
  local_1c = 0x10;
  local_20 = 0x100;
  local_24 = 0x32;
  local_28 = 100;
  hnsw::L2Distance::L2Distance
            ((L2Distance *)in_stack_fffffffffffffcb0,
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  uVar6 = 0x32;
  hnsw::HNSWIndex::HNSWIndex
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (uint32_t)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
             (uint32_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,M_00,
             in_stack_fffffffffffffd10);
  hnsw::BruteForceIndex::BruteForceIndex
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             (uint32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
             (uint32_t)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  local_160 = std::chrono::_V2::steady_clock::now();
  hnsw::HNSWIndex::Build(in_stack_fffffffffffffcc0);
  local_168 = std::chrono::_V2::steady_clock::now();
  local_180 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffcb8,
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffcb0);
  local_178.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,uVar6));
  local_170 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_178);
  poVar2 = std::operator<<((ostream *)&std::cout,"HNSW Build time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_170);
  poVar2 = std::operator<<(poVar2,"ms");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  points_00 = std::operator<<((ostream *)&std::cout,"Top layer: ");
  lVar1 = hnsw::HNSWIndex::TopLayer(&local_100);
  pvVar3 = (void *)std::ostream::operator<<(points_00,lVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Distance calculations: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar4,local_38);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_188 = operator_new__(32000);
  GenerateRandomFloat(in_stack_00002400,in_stack_000023f8);
  hnsw::HNSWIndex::SetEfSearch(&local_100,0x100);
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
               *)0x1126ce);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8,
           (allocator_type *)in_stack_fffffffffffffcc0);
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::~allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                *)0x1126f7);
  local_1b0 = std::chrono::_V2::steady_clock::now();
  local_160 = local_1b0;
  for (local_1b4 = 0; local_1b4 < 1000; local_1b4 = local_1b4 + 1) {
    hnsw::HNSWIndex::Search
              (in_stack_fffffffffffffd38,(uint32_t)((ulong)in_stack_fffffffffffffd30 >> 0x20),
               in_stack_fffffffffffffd28);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::operator[](&local_1a0,(ulong)local_1b4);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    operator=((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)in_stack_fffffffffffffcc0,
              (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)in_stack_fffffffffffffcb8);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)in_stack_fffffffffffffcc0);
  }
  local_1d8 = std::chrono::_V2::steady_clock::now();
  local_168 = local_1d8;
  local_1e8 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffcb8,
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffcb0);
  local_1e0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,uVar6));
  local_170 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1e0);
  poVar4 = std::operator<<((ostream *)&std::cout,"HNSW: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_170 / 1000);
  this = (BruteForceIndex *)std::operator<<(poVar4,anon_var_dwarf_9e35);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  puVar7 = &local_201;
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
               *)0x112963);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8,
           (allocator_type *)in_stack_fffffffffffffcc0);
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::~allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                *)0x112989);
  local_210 = std::chrono::_V2::steady_clock::now();
  local_160 = local_210;
  for (local_214 = 0; local_214 < 1000; local_214 = local_214 + 1) {
    hnsw::BruteForceIndex::Search(this,(uint32_t)((ulong)puVar7 >> 0x20),in_stack_fffffffffffffd08);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::operator[](&local_200,(ulong)local_214);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    operator=((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)in_stack_fffffffffffffcc0,
              (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)in_stack_fffffffffffffcb8);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)in_stack_fffffffffffffcc0);
  }
  local_238 = std::chrono::_V2::steady_clock::now();
  local_168 = local_238;
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffcb8,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffcb0);
  local_240.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,uVar6));
  local_170 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_240);
  poVar4 = std::operator<<((ostream *)&std::cout,"BruteForce: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_170 / 1000);
  poVar4 = std::operator<<(poVar4,anon_var_dwarf_9e35);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Recall@100: ");
  dVar5 = ComputeRecall((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         *)poVar2,
                        (vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         *)points_00);
  pvVar3 = (void *)std::ostream::operator<<(poVar4,dVar5);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  this_00 = local_18;
  if (local_18 !=
      (vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
       *)0x0) {
    operator_delete(local_18);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188);
  }
  local_4 = 0;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(this_00);
  hnsw::BruteForceIndex::~BruteForceIndex((BruteForceIndex *)in_stack_fffffffffffffcb0);
  hnsw::HNSWIndex::~HNSWIndex(in_stack_fffffffffffffcb0);
  hnsw::L2Distance::~L2Distance((L2Distance *)0x112c74);
  return local_4;
}

Assistant:

int main(void) {
  const uint32_t dim = 8;
  const uint32_t n_points = 100000;
  const uint32_t n_queries = 1000;
  float *points = new float[dim * n_points];
  GenerateRandomFloat(points, dim * n_points);

  const uint32_t M = 16;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 50;
  const uint32_t K = 100;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(points, n_points, dim, distance, M, ef_construction);
  hnsw::BruteForceIndex bf_index(points, n_points, dim, distance);

  // Test build
  auto t0 = std::chrono::steady_clock::now();
  hnsw_index.Build();
  auto t1 = std::chrono::steady_clock::now();
  auto duration = duration_cast<milliseconds>(t1 - t0).count();
  cout << "HNSW Build time: " << duration << "ms" << endl;
  cout << "Top layer: " << hnsw_index.TopLayer() << endl;
  cout << "Distance calculations: " << distance.num << endl;

  float *queries = new float[dim * n_queries];
  GenerateRandomFloat(queries, dim * n_queries);

  hnsw_index.SetEfSearch(ef_search);

  std::vector<PointSet> result1(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result1[i] = hnsw_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "HNSW: " << duration / n_queries << " µs/query" << endl;

  std::vector<PointSet> result2(n_queries);
  t0 = std::chrono::steady_clock::now();
  for (uint32_t i = 0; i < n_queries; i++) {
    result2[i] = bf_index.Search(K, &queries[i * dim]);
  }
  t1 = std::chrono::steady_clock::now();
  duration = duration_cast<microseconds>(t1 - t0).count();
  cout << "BruteForce: " << duration / n_queries << " µs/query" << endl;

  cout << "Recall@100: " << ComputeRecall(result2, result1) << endl;

  delete points;
  delete queries;

  return 0;
}